

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_iastore(ExecutionEngine *this)

{
  int iVar1;
  ValueType VVar2;
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar3;
  Value VVar4;
  Value VVar5;
  Value VVar6;
  ValueType VStack_54;
  Value arrayref;
  Value index;
  Value value;
  ArrayObject *array;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  index.data.longValue._4_4_ = VVar4.type;
  if (index.data.longValue._4_4_ != 4) {
    __assert_fail("value.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x607,"void ExecutionEngine::i_iastore()");
  }
  VVar5 = Frame::popTopOfOperandStack(this_01);
  arrayref.data.longValue._4_4_ = VVar5.type;
  if (arrayref.data.longValue._4_4_ != 4) {
    __assert_fail("index.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x609,"void ExecutionEngine::i_iastore()");
  }
  VVar6 = Frame::popTopOfOperandStack(this_01);
  VStack_54 = VVar6.type;
  if (VStack_54 != REFERENCE) {
    __assert_fail("arrayref.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x60b,"void ExecutionEngine::i_iastore()");
  }
  arrayref._0_8_ = VVar6.data;
  iVar1 = (*(code *)**(undefined8 **)arrayref._0_8_)();
  if (iVar1 == 2) {
    if (arrayref._0_8_ == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"NullPointerException");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    index.printType = VVar5.data._0_4_;
    VVar2 = ArrayObject::getSize((ArrayObject *)arrayref._0_8_);
    if ((index.printType < VVar2) && (-1 < (int)index.printType)) {
      stack0xffffffffffffffcc = VVar4._4_12_;
      index.data._0_4_ = 4;
      VVar2 = ArrayObject::arrayContentType((ArrayObject *)arrayref._0_8_);
      if (VVar2 == INT) {
        value._0_8_ = VVar4.data;
        VVar4.data = (anon_union_8_10_52016fac_for_data)value._0_8_;
        VVar4.printType = index.data._0_4_;
        VVar4.type = index.data._4_4_;
        ArrayObject::changeValueAt((ArrayObject *)arrayref._0_8_,index.printType,VVar4);
        this_01->pc = this_01->pc + 1;
        return;
      }
      __assert_fail("value.type == array->arrayContentType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x61b,"void ExecutionEngine::i_iastore()");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"ArrayIndexOutOfBoundsException");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  __assert_fail("(arrayref.data.object)->objectType() == ObjectType::ARRAY",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x60c,"void ExecutionEngine::i_iastore()");
}

Assistant:

void ExecutionEngine::i_iastore() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
	ArrayObject *array;

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::INT);
    Value index = topFrame->popTopOfOperandStack();
    assert(index.type == ValueType::INT);
    Value arrayref = topFrame->popTopOfOperandStack();
    assert(arrayref.type == ValueType::REFERENCE);
    assert((arrayref.data.object)->objectType() == ObjectType::ARRAY);

    array = (ArrayObject *) arrayref.data.object;

    if (array == NULL) {
        cerr << "NullPointerException" << endl;
        exit(1);
    }
    if (index.data.intValue >= array->getSize() || index.data.intValue < 0) {
        cerr << "ArrayIndexOutOfBoundsException" << endl;
        exit(2);
    }

    value.printType = ValueType::INT;
    
    assert(value.type == array->arrayContentType());
    array->changeValueAt(index.data.intValue, value);
    
    topFrame->pc += 1;
}